

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O2

bool Option::postProcessProject(QMakeProject *project)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  ProStringList *pPVar5;
  ProString *this;
  long in_FS_OFFSET;
  ProString local_a8;
  QArrayDataPointer<char16_t> local_78;
  ProString local_60;
  long local_30;
  
  this = &local_a8;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)&local_60,"QMAKE_EXT_CPP");
  pPVar5 = QMakeEvaluator::valuesRef(&project->super_QMakeEvaluator,(ProKey *)&local_60);
  ProStringList::toQStringList((QStringList *)&local_a8,pPVar5);
  QArrayDataPointer<QString>::operator=(&cpp_ext.d,(QArrayDataPointer<QString> *)&local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  ProKey::ProKey((ProKey *)&local_60,"QMAKE_EXT_H");
  pPVar5 = QMakeEvaluator::valuesRef(&project->super_QMakeEvaluator,(ProKey *)&local_60);
  ProStringList::toQStringList((QStringList *)&local_a8,pPVar5);
  QArrayDataPointer<QString>::operator=(&h_ext.d,(QArrayDataPointer<QString> *)&local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  ProKey::ProKey((ProKey *)&local_60,"QMAKE_EXT_C");
  pPVar5 = QMakeEvaluator::valuesRef(&project->super_QMakeEvaluator,(ProKey *)&local_60);
  ProStringList::toQStringList((QStringList *)&local_a8,pPVar5);
  QArrayDataPointer<QString>::operator=(&c_ext.d,(QArrayDataPointer<QString> *)&local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_EXT_OBJC");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = objc_ext.d.size;
  pcVar2 = objc_ext.d.ptr;
  pDVar1 = objc_ext.d.d;
  objc_ext.d.d = local_78.d;
  objc_ext.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  objc_ext.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_EXT_OBJCXX");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = objcpp_ext.d.size;
  pcVar2 = objcpp_ext.d.ptr;
  pDVar1 = objcpp_ext.d.d;
  objcpp_ext.d.d = local_78.d;
  objcpp_ext.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  objcpp_ext.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_EXT_RES");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = res_ext.d.size;
  pcVar2 = res_ext.d.ptr;
  pDVar1 = res_ext.d.d;
  res_ext.d.d = local_78.d;
  res_ext.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  res_ext.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_EXT_PKGCONFIG");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = pkgcfg_ext.d.size;
  pcVar2 = pkgcfg_ext.d.ptr;
  pDVar1 = pkgcfg_ext.d.d;
  pkgcfg_ext.d.d = local_78.d;
  pkgcfg_ext.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  pkgcfg_ext.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_EXT_LIBTOOL");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = libtool_ext.d.size;
  pcVar2 = libtool_ext.d.ptr;
  pDVar1 = libtool_ext.d.d;
  libtool_ext.d.d = local_78.d;
  libtool_ext.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  libtool_ext.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_EXT_PRL");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = prl_ext.d.size;
  pcVar2 = prl_ext.d.ptr;
  pDVar1 = prl_ext.d.d;
  prl_ext.d.d = local_78.d;
  prl_ext.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  prl_ext.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_EXT_UI");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = ui_ext.d.size;
  pcVar2 = ui_ext.d.ptr;
  pDVar1 = ui_ext.d.d;
  ui_ext.d.d = local_78.d;
  ui_ext.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  ui_ext.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_EXT_CPP_MOC");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = cpp_moc_ext.d.size;
  pcVar2 = cpp_moc_ext.d.ptr;
  pDVar1 = cpp_moc_ext.d.d;
  cpp_moc_ext.d.d = local_78.d;
  cpp_moc_ext.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  cpp_moc_ext.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_EXT_LEX");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = lex_ext.d.size;
  pcVar2 = lex_ext.d.ptr;
  pDVar1 = lex_ext.d.d;
  lex_ext.d.d = local_78.d;
  lex_ext.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  lex_ext.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_EXT_YACC");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = yacc_ext.d.size;
  pcVar2 = yacc_ext.d.ptr;
  pDVar1 = yacc_ext.d.d;
  yacc_ext.d.d = local_78.d;
  yacc_ext.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  yacc_ext.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_EXT_OBJ");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = obj_ext.d.size;
  pcVar2 = obj_ext.d.ptr;
  pDVar1 = obj_ext.d.d;
  obj_ext.d.d = local_78.d;
  obj_ext.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  obj_ext.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_H_MOD_MOC");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = h_moc_mod.d.size;
  pcVar2 = h_moc_mod.d.ptr;
  pDVar1 = h_moc_mod.d.d;
  h_moc_mod.d.d = local_78.d;
  h_moc_mod.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  h_moc_mod.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_MOD_LEX");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = lex_mod.d.size;
  pcVar2 = lex_mod.d.ptr;
  pDVar1 = lex_mod.d.d;
  lex_mod.d.d = local_78.d;
  lex_mod.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  lex_mod.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProKey::ProKey((ProKey *)&local_a8,"QMAKE_MOD_YACC");
  QMakeEvaluator::first(&local_60,&project->super_QMakeEvaluator,(ProKey *)&local_a8);
  ProString::toQString((QString *)&local_78,&local_60);
  qVar3 = yacc_mod.d.size;
  pcVar2 = yacc_mod.d.ptr;
  pDVar1 = yacc_mod.d.d;
  yacc_mod.d.d = local_78.d;
  yacc_mod.d.ptr = local_78.ptr;
  local_78.d = pDVar1;
  local_78.ptr = pcVar2;
  yacc_mod.d.size = local_78.size;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  ProString::ProString(&local_60,&(project->super_QMakeEvaluator).m_dirSep);
  ProString::toQString(&local_a8.m_string,&local_60);
  qVar3 = dir_sep.d.size;
  pcVar2 = dir_sep.d.ptr;
  pDVar1 = dir_sep.d.d;
  dir_sep.d.d = local_a8.m_string.d.d;
  dir_sep.d.ptr = local_a8.m_string.d.ptr;
  local_a8.m_string.d.d = pDVar1;
  local_a8.m_string.d.ptr = pcVar2;
  dir_sep.d.size = local_a8.m_string.d.size;
  local_a8.m_string.d.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  local_60.m_string.d.d = (project->super_QMakeEvaluator).m_buildRoot.d.d;
  local_60.m_string.d.ptr = (project->super_QMakeEvaluator).m_buildRoot.d.ptr;
  local_60.m_string.d.size = (project->super_QMakeEvaluator).m_buildRoot.d.size;
  if (local_60.m_string.d.d != (Data *)0x0) {
    LOCK();
    ((local_60.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
    ;
    UNLOCK();
  }
  if (local_60.m_string.d.size == 0) {
    this = &local_60;
  }
  else {
    local_a8.m_string.d.d = (project->super_QMakeEvaluator).m_buildRoot.d.d;
    local_a8.m_string.d.ptr = (project->super_QMakeEvaluator).m_buildRoot.d.ptr;
    local_a8.m_string.d.size = (project->super_QMakeEvaluator).m_buildRoot.d.size;
    if (local_a8.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    cVar4 = QString::startsWith((QString *)&output_dir,(CaseSensitivity)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
    if (cVar4 == '\0') goto LAB_0020e759;
    local_a8.m_string.d.d = (project->super_QMakeEvaluator).m_buildRoot.d.d;
    local_a8.m_string.d.ptr = (project->super_QMakeEvaluator).m_buildRoot.d.ptr;
    local_a8.m_string.d.size = (project->super_QMakeEvaluator).m_buildRoot.d.size;
    if (local_a8.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    QString::mid((longlong)&local_60,0x26bc88);
    mkfile::cachefile_depth = QString::count((QChar)(char16_t)&local_60,0x2f);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
LAB_0020e759:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool Option::postProcessProject(QMakeProject *project)
{
    Option::cpp_ext = project->values("QMAKE_EXT_CPP").toQStringList();
    Option::h_ext = project->values("QMAKE_EXT_H").toQStringList();
    Option::c_ext = project->values("QMAKE_EXT_C").toQStringList();
    Option::objc_ext = project->first("QMAKE_EXT_OBJC").toQString();
    Option::objcpp_ext = project->first("QMAKE_EXT_OBJCXX").toQString();
    Option::res_ext = project->first("QMAKE_EXT_RES").toQString();
    Option::pkgcfg_ext = project->first("QMAKE_EXT_PKGCONFIG").toQString();
    Option::libtool_ext = project->first("QMAKE_EXT_LIBTOOL").toQString();
    Option::prl_ext = project->first("QMAKE_EXT_PRL").toQString();
    Option::ui_ext = project->first("QMAKE_EXT_UI").toQString();
    Option::cpp_moc_ext = project->first("QMAKE_EXT_CPP_MOC").toQString();
    Option::lex_ext = project->first("QMAKE_EXT_LEX").toQString();
    Option::yacc_ext = project->first("QMAKE_EXT_YACC").toQString();
    Option::obj_ext = project->first("QMAKE_EXT_OBJ").toQString();
    Option::h_moc_mod = project->first("QMAKE_H_MOD_MOC").toQString();
    Option::lex_mod = project->first("QMAKE_MOD_LEX").toQString();
    Option::yacc_mod = project->first("QMAKE_MOD_YACC").toQString();

    Option::dir_sep = project->dirSep().toQString();

    if (!project->buildRoot().isEmpty() && Option::output_dir.startsWith(project->buildRoot()))
        Option::mkfile::cachefile_depth =
                Option::output_dir.mid(project->buildRoot().size()).count('/');

    return true;
}